

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

Matrix * operator+(Matrix *__return_storage_ptr__,Matrix *lhs,Matrix *rhs)

{
  Fraction *pFVar1;
  Fraction *b;
  Fraction FVar2;
  invalid_argument *this;
  int i;
  int j;
  
  if (lhs->n_ == rhs->n_) {
    if (lhs->m_ == rhs->m_) {
      i = 0;
      Matrix::Matrix(__return_storage_ptr__,lhs->n_,lhs->m_,0);
      if (0 < __return_storage_ptr__->n_) {
        do {
          if (0 < __return_storage_ptr__->m_) {
            j = 0;
            do {
              pFVar1 = Matrix::At(lhs,i,j);
              b = Matrix::At(rhs,i,j);
              FVar2 = operator+(pFVar1,b);
              pFVar1 = Matrix::At(__return_storage_ptr__,i,j);
              *pFVar1 = FVar2;
              j = j + 1;
            } while (j < __return_storage_ptr__->m_);
          }
          i = i + 1;
        } while (i < __return_storage_ptr__->n_);
      }
      return __return_storage_ptr__;
    }
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"[SUM] Mismatched number of columns");
  }
  else {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"[SUM] Mismatched number of rows");
  }
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Matrix operator+(const Matrix& lhs, const Matrix& rhs) {
  if (lhs.GetNumRows() != rhs.GetNumRows()) {
    throw std::invalid_argument("[SUM] Mismatched number of rows");
  }

  if (lhs.GetNumColumns() != rhs.GetNumColumns()) {
    throw std::invalid_argument("[SUM] Mismatched number of columns");
  }

  Matrix result(lhs.GetNumRows(), lhs.GetNumColumns());
  for (int i = 0; i < result.GetNumRows(); ++i) {
    for (int j = 0; j < result.GetNumColumns(); ++j) {
      result.At(i, j) = lhs.At(i, j) + rhs.At(i, j);
    }
  }

  return result;
}